

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_blur_geometry_device.cpp
# Opt level: O3

Sphere * embree::addUserGeometrySphere(RTCScene scene,Vec3fa *p,float r,uint num_time_steps)

{
  undefined8 uVar1;
  uint uVar2;
  undefined8 uVar3;
  Sphere *pSVar4;
  
  uVar3 = rtcNewGeometry(g_device,0x78);
  pSVar4 = (Sphere *)alignedUSMMalloc(0x20,0x10,DEVICE_READ_ONLY);
  uVar1 = *(undefined8 *)((long)&p->field_0 + 8);
  *(undefined8 *)&(pSVar4->p).field_0 = *(undefined8 *)&p->field_0;
  *(undefined8 *)((long)&(pSVar4->p).field_0 + 8) = uVar1;
  pSVar4->r = r;
  uVar2 = rtcAttachGeometry(scene,uVar3);
  pSVar4->geomID = uVar2;
  pSVar4->num_time_steps = num_time_steps;
  rtcSetGeometryUserPrimitiveCount(uVar3,1);
  rtcSetGeometryTimeStepCount(uVar3,num_time_steps);
  rtcSetGeometryUserData(uVar3,pSVar4);
  rtcSetGeometryBoundsFunction(uVar3,sphereBoundsFunc,0);
  rtcCommitGeometry(uVar3);
  rtcReleaseGeometry(uVar3);
  return pSVar4;
}

Assistant:

Sphere* addUserGeometrySphere (RTCScene scene, const Vec3fa& p, float r, unsigned int num_time_steps)
{
  RTCGeometry geom = rtcNewGeometry(g_device, RTC_GEOMETRY_TYPE_USER);
  Sphere* sphere = (Sphere*) alignedUSMMalloc(sizeof(Sphere),16);
  sphere->p = p;
  sphere->r = r;
  sphere->geomID = rtcAttachGeometry(scene,geom);
  sphere->num_time_steps = num_time_steps;
  rtcSetGeometryUserPrimitiveCount(geom,1);
  rtcSetGeometryTimeStepCount(geom,num_time_steps);
  rtcSetGeometryUserData(geom,sphere);
  rtcSetGeometryBoundsFunction(geom,sphereBoundsFunc,nullptr);
#if !USE_ARGUMENT_CALLBACKS
  rtcSetGeometryIntersectFunction(geom,sphereIntersectFuncPtr);
  rtcSetGeometryOccludedFunction (geom,sphereOccludedFuncPtr);
#endif
  rtcCommitGeometry(geom);
  rtcReleaseGeometry(geom);
  return sphere;
}